

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_log.cc
# Opt level: O1

bool __thiscall BuildLog::WriteEntry(BuildLog *this,FILE *f,LogEntry *entry)

{
  int iVar1;
  
  iVar1 = fprintf((FILE *)f,"%d\t%d\t%ld\t%s\t%lx\n",(ulong)(uint)entry->start_time,
                  (ulong)(uint)entry->end_time,entry->mtime,(entry->output)._M_dataplus._M_p,
                  entry->command_hash);
  return 0 < iVar1;
}

Assistant:

bool BuildLog::WriteEntry(FILE* f, const LogEntry& entry) {
  return fprintf(f, "%d\t%d\t%" PRId64 "\t%s\t%" PRIx64 "\n",
          entry.start_time, entry.end_time, entry.mtime,
          entry.output.c_str(), entry.command_hash) > 0;
}